

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  EnumDescriptor *this_00;
  Descriptor *this_01;
  ServiceDescriptor *this_02;
  string *psVar5;
  int local_30;
  int local_2c;
  int i_2;
  int i_1;
  int i;
  bool found_conflict;
  string *error_local;
  FileGenerator *this_local;
  
  bVar2 = false;
  i_2 = 0;
  while( true ) {
    iVar4 = FileDescriptor::enum_type_count(this->file_);
    bVar1 = false;
    if (i_2 < iVar4) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) break;
    this_00 = FileDescriptor::enum_type(this->file_,i_2);
    psVar5 = EnumDescriptor::name_abi_cxx11_(this_00);
    _Var3 = std::operator==(psVar5,&this->classname_);
    if (_Var3) {
      bVar2 = true;
    }
    i_2 = i_2 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar4 = FileDescriptor::message_type_count(this->file_);
    bVar1 = false;
    if (local_2c < iVar4) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) break;
    this_01 = FileDescriptor::message_type(this->file_,local_2c);
    psVar5 = Descriptor::name_abi_cxx11_(this_01);
    _Var3 = std::operator==(psVar5,&this->classname_);
    if (_Var3) {
      bVar2 = true;
    }
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar4 = FileDescriptor::service_count(this->file_);
    bVar1 = false;
    if (local_30 < iVar4) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) break;
    this_02 = FileDescriptor::service(this->file_,local_30);
    psVar5 = ServiceDescriptor::name_abi_cxx11_(this_02);
    _Var3 = std::operator==(psVar5,&this->classname_);
    if (_Var3) {
      bVar2 = true;
    }
    local_30 = local_30 + 1;
  }
  if (bVar2) {
    FileDescriptor::name_abi_cxx11_(this->file_);
    std::__cxx11::string::assign((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
  }
  return !bVar2;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.

  bool found_conflict = false;
  for (int i = 0; i < file_->enum_type_count() && !found_conflict; i++) {
    if (file_->enum_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->message_type_count() && !found_conflict; i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->service_count() && !found_conflict; i++) {
    if (file_->service(i)->name() == classname_) {
      found_conflict = true;
    }
  }

  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }

  return true;
}